

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_buf.c
# Opt level: O0

int uo_buf_printf_append(uo_buf *buf,char *format,...)

{
  char in_AL;
  ptrdiff_t pVar1;
  uchar *puVar2;
  uo_buf puVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  uint64_t local_48;
  size_t size;
  undefined4 local_38;
  int len;
  va_list args;
  int n;
  char *format_local;
  uo_buf *buf_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  pVar1 = uo_buf_get_len_after_ptr(*buf);
  args[0].reg_save_area._4_4_ = (int)pVar1;
  args[0].overflow_arg_area = local_f8;
  args[0]._0_8_ = &stack0x00000008;
  len = 0x30;
  local_38 = 0x10;
  puVar2 = uo_buf_get_ptr(*buf);
  size._4_4_ = vsnprintf((char *)puVar2,(long)args[0].reg_save_area._4_4_,format,&local_38);
  if (args[0].reg_save_area._4_4_ <= size._4_4_) {
    pVar1 = uo_buf_get_len_before_ptr(*buf);
    local_48 = uo_ceil_pow2(pVar1 + size._4_4_ + 0x31);
    puVar3 = uo_buf_realloc(*buf,local_48 - 0x10);
    *buf = puVar3;
    args[0].overflow_arg_area = local_f8;
    args[0]._0_8_ = &stack0x00000008;
    len = 0x30;
    local_38 = 0x10;
    puVar2 = uo_buf_get_ptr(*buf);
    vsprintf((char *)puVar2,format,&local_38);
  }
  uo_buf_set_ptr_rel(*buf,(long)size._4_4_);
  return size._4_4_;
}

Assistant:

int uo_buf_printf_append(
    uo_buf *buf,
    const char *format,
    ...)
{
    int n = uo_buf_get_len_after_ptr(*buf);

    #ifdef _WIN32
        // vsnprintf not ansi compliant

        va_list args[2];
        va_start(args[0], format);
        va_copy(args[1], args[0]);
        int len = vsnprintf(NULL, 0, format, args[0]);
        va_end(args[0]);

        if (len >= n)
        {
            size_t size = uo_ceil_pow2(uo_buf_get_len_before_ptr(*buf) + len + UO_BUF_GROW_SIZE + 1);
            *buf = uo_buf_realloc(*buf, size - UO_BUF_HEADER_SIZE);
        }

        vsprintf(uo_buf_get_ptr(*buf), format, args[1]);
        va_end(args[1]);

    #else

        va_list args;
        va_start(args, format);
        int len = vsnprintf(uo_buf_get_ptr(*buf), n, format, args);
        va_end(args);

        if (len >= n)
        {
            size_t size = uo_ceil_pow2(uo_buf_get_len_before_ptr(*buf) + len + UO_BUF_GROW_SIZE + 1);
            *buf = uo_buf_realloc(*buf, size - UO_BUF_HEADER_SIZE);
            va_start(args, format);
            vsprintf(uo_buf_get_ptr(*buf), format, args);
            va_end(args);
        }

    #endif

    uo_buf_set_ptr_rel(*buf, len);

    return len;
}